

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

LY_ERR ly_in_read(ly_in *in,void *buf,size_t count)

{
  size_t count_local;
  void *buf_local;
  ly_in *in_local;
  
  if (in == (ly_in *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_read");
    in_local._4_4_ = LY_EINVAL;
  }
  else if (buf == (void *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","buf","ly_in_read");
    in_local._4_4_ = LY_EINVAL;
  }
  else if ((in->length == 0) || (count <= in->length - ((long)in->current - (long)in->start))) {
    if (count != 0) {
      memcpy(buf,in->current,count);
    }
    in->current = in->current + count;
    in_local._4_4_ = LY_SUCCESS;
  }
  else {
    in_local._4_4_ = LY_EDENIED;
  }
  return in_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_read(struct ly_in *in, void *buf, size_t count)
{
    LY_CHECK_ARG_RET(NULL, in, buf, LY_EINVAL);

    if (in->length && (in->length - (in->current - in->start) < count)) {
        /* EOF */
        return LY_EDENIED;
    }

    if (count) {
        memcpy(buf, in->current, count);
    }
    in->current += count;
    return LY_SUCCESS;
}